

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

bool __thiscall util::fs::FileLock::wait_lock(FileLock *this,string *filename,int retries,int sleep)

{
  bool local_31;
  int local_24;
  int sleep_local;
  int retries_local;
  string *filename_local;
  FileLock *this_local;
  
  local_24 = retries;
  while( true ) {
    local_31 = false;
    if (0 < local_24) {
      local_31 = is_locked(this,filename);
    }
    if (local_31 == false) break;
    system::sleep(sleep);
    local_24 = local_24 + -1;
    if (local_24 < 1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
FileLock::wait_lock (std::string const& filename, int retries, int sleep)
{
    while (retries > 0 && this->is_locked(filename))
    {
        system::sleep(sleep);
        retries -= 1;
        if (retries <= 0)
            return false;
    }
    return true;
}